

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O3

bool __thiscall
cmCacheManager::ReadPropertyEntry(cmCacheManager *this,string *entryKey,CacheEntry *e)

{
  ulong uVar1;
  pointer pcVar2;
  cmCacheManager *pcVar3;
  int iVar4;
  size_t sVar5;
  mapped_type *this_00;
  char **ppcVar6;
  char *__s;
  string key;
  allocator<char> local_81;
  undefined1 local_80 [32];
  CacheEntry *local_60;
  cmCacheManager *local_58;
  key_type local_50;
  
  if ((e->Type == INTERNAL) && (PersistentProperties[0] != (char *)0x0)) {
    uVar1 = entryKey->_M_string_length;
    pcVar2 = (entryKey->_M_dataplus)._M_p;
    ppcVar6 = PersistentProperties;
    __s = PersistentProperties[0];
    local_60 = e;
    local_58 = this;
    do {
      sVar5 = strlen(__s);
      if (((sVar5 + 1 < uVar1) && (pcVar2[~sVar5 + uVar1] == '-')) &&
         (iVar4 = strcmp(pcVar2 + ~sVar5 + uVar1 + 1,__s), iVar4 == 0)) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)entryKey);
        pcVar3 = local_58;
        CacheIterator::CacheIterator((CacheIterator *)local_80,local_58,local_50._M_dataplus._M_p);
        if ((_Base_ptr)local_80._8_8_ == (_Base_ptr)(local_80._0_8_ + 0x10)) {
          this_00 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                    ::operator[](&pcVar3->Cache,&local_50);
          this_00->Type = UNINITIALIZED;
          std::__cxx11::string::string<std::allocator<char>>((string *)local_80,*ppcVar6,&local_81);
          CacheEntry::SetProperty(this_00,(string *)local_80,(local_60->Value)._M_dataplus._M_p);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>((string *)local_80,*ppcVar6,&local_81);
          CacheEntry::SetProperty
                    ((CacheEntry *)(local_80._8_8_ + 0x40),(string *)local_80,
                     (local_60->Value)._M_dataplus._M_p);
        }
        if ((cmCacheManager *)local_80._0_8_ != (cmCacheManager *)(local_80 + 0x10)) {
          operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        return true;
      }
      __s = ppcVar6[1];
      ppcVar6 = ppcVar6 + 1;
    } while (__s != (char *)0x0);
  }
  return false;
}

Assistant:

bool cmCacheManager::ReadPropertyEntry(std::string const& entryKey,
                                       CacheEntry& e)
{
  // All property entries are internal.
  if (e.Type != cmStateEnums::INTERNAL) {
    return false;
  }

  const char* end = entryKey.c_str() + entryKey.size();
  for (const char** p = cmCacheManager::PersistentProperties; *p; ++p) {
    std::string::size_type plen = strlen(*p) + 1;
    if (entryKey.size() > plen && *(end - plen) == '-' &&
        strcmp(end - plen + 1, *p) == 0) {
      std::string key = entryKey.substr(0, entryKey.size() - plen);
      cmCacheManager::CacheIterator it = this->GetCacheIterator(key.c_str());
      if (it.IsAtEnd()) {
        // Create an entry and store the property.
        CacheEntry& ne = this->Cache[key];
        ne.Type = cmStateEnums::UNINITIALIZED;
        ne.SetProperty(*p, e.Value.c_str());
      } else {
        // Store this property on its entry.
        it.SetProperty(*p, e.Value.c_str());
      }
      return true;
    }
  }
  return false;
}